

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utf8.c
# Opt level: O1

_Bool dotest(char *file,int line,char *input,unsigned_long *chars,size_t nchars)

{
  byte bVar1;
  byte *pbVar2;
  size_t sVar3;
  unsigned_long uVar4;
  char *__format;
  ulong uVar5;
  char *before;
  byte *pbVar6;
  bool bVar7;
  byte *local_58;
  size_t local_50;
  unsigned_long *local_48;
  char *local_40;
  byte *local_38;
  
  local_58 = (byte *)input;
  local_50 = nchars;
  local_48 = chars;
  sVar3 = strlen(input);
  local_38 = (byte *)(input + sVar3 + 1);
  local_40 = input;
  printf("%s:%d: test start\n",file,line);
  uVar5 = 0;
  do {
    pbVar6 = local_58;
    if (local_38 <= local_58) {
      bVar7 = local_50 <= uVar5;
      __format = "%s:%d: FAIL: expected further output\n";
      if (bVar7) {
        __format = "%s:%d: pass\n";
      }
      printf(__format,file,line);
      return bVar7;
    }
    uVar4 = decode_utf8((char **)&local_58);
    printf("%s:%d in+%zu out+%zu:",file,line,(long)pbVar6 - (long)local_40,uVar5);
    pbVar2 = local_58;
    if (pbVar6 < local_58) {
      do {
        bVar1 = *pbVar6;
        pbVar6 = pbVar6 + 1;
        printf(" %02x",(ulong)bVar1);
      } while (pbVar6 != pbVar2);
    }
    printf(" -> U-%08lx\n",uVar4);
    if (uVar5 < local_50) {
      if (local_48[uVar5] == uVar4) {
        uVar5 = uVar5 + 1;
        bVar7 = true;
      }
      else {
        bVar7 = false;
        printf("%s:%d: FAIL: expected U-%08lx\n",file,line);
      }
    }
    else {
      bVar7 = false;
      printf("%s:%d: FAIL: expected no further output\n",file,line);
    }
  } while (bVar7);
  return false;
}

Assistant:

bool dotest(const char *file, int line, const char *input,
            const unsigned long *chars, size_t nchars)
{
    const char *start = input;
    const char *end = input + strlen(input) + 1;
    size_t noutput = 0;

    printf("%s:%d: test start\n", file, line);

    while (input < end) {
        const char *before = input;
        unsigned long wc = decode_utf8(&input);

        printf("%s:%d in+%"SIZEu" out+%"SIZEu":",
               file, line, (size_t)(before-start), noutput);
        while (before < input)
            printf(" %02x", (unsigned)(unsigned char)(*before++));
        printf(" -> U-%08lx\n", wc);

        if (noutput >= nchars) {
            printf("%s:%d: FAIL: expected no further output\n", file, line);
            return false;
        }

        if (chars[noutput] != wc) {
            printf("%s:%d: FAIL: expected U-%08lx\n",
                   file, line, chars[noutput]);
            return false;
        }

        noutput++;
    }

    if (noutput < nchars) {
        printf("%s:%d: FAIL: expected further output\n", file, line);
        return false;
    }

    printf("%s:%d: pass\n", file, line);
    return true;
}